

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stacktrace.cc
# Opt level: O1

int absl::GetStackTraceWithContext
              (void **result,int max_depth,int skip_count,void *uc,int *min_dropped_frames)

{
  int iVar1;
  code *pcVar2;
  
  pcVar2 = UnwindImpl<false,true>;
  if (_ZN4absl12_GLOBAL__N_16customE_0 != (code *)0x0) {
    pcVar2 = _ZN4absl12_GLOBAL__N_16customE_0;
  }
  iVar1 = (*pcVar2)(result,0,max_depth,skip_count + 1,uc,min_dropped_frames);
  return iVar1;
}

Assistant:

ABSL_ATTRIBUTE_NOINLINE ABSL_ATTRIBUTE_NO_TAIL_CALL int
GetStackTraceWithContext(void** result, int max_depth, int skip_count,
                         const void* uc, int* min_dropped_frames) {
  return Unwind<false, true>(result, nullptr, max_depth, skip_count, uc,
                             min_dropped_frames);
}